

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

uint32_t hydro_random_u32(void)

{
  uint32_t uVar1;
  byte bVar2;
  long in_FS_OFFSET;
  
  hydro_random_ensure_initialized();
  bVar2 = *(byte *)(in_FS_OFFSET + -7);
  if (bVar2 < 4) {
    hydro_random_ratchet();
    bVar2 = *(byte *)(in_FS_OFFSET + -7);
  }
  uVar1 = *(uint32_t *)(in_FS_OFFSET + (-0x30 - (ulong)bVar2));
  *(byte *)(in_FS_OFFSET + -7) = bVar2 - 4;
  return uVar1;
}

Assistant:

uint32_t
hydro_random_u32(void)
{
    uint32_t v;

    hydro_random_ensure_initialized();
    if (hydro_random_context.available < 4) {
        hydro_random_ratchet();
    }
    memcpy(&v, &hydro_random_context.state[gimli_RATE - hydro_random_context.available], 4);
    hydro_random_context.available -= 4;

    return v;
}